

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void __thiscall ImDrawDataBuilder::FlattenIntoSingleLayer(ImDrawDataBuilder *this)

{
  int iVar1;
  int iVar2;
  ImDrawList **ppIVar3;
  ImDrawList **ppIVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  ulong uVar8;
  
  iVar1 = this->Layers[0].Size;
  iVar6 = this->Layers[1].Size + iVar1;
  iVar2 = this->Layers[0].Capacity;
  if (iVar2 < iVar6) {
    if (iVar2 == 0) {
      iVar7 = 8;
    }
    else {
      iVar7 = iVar2 / 2 + iVar2;
    }
    if (iVar7 <= iVar6) {
      iVar7 = iVar6;
    }
    if (iVar2 < iVar7) {
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      ppIVar4 = (ImDrawList **)(*GImAllocatorAllocFunc)((long)iVar7 << 3,GImAllocatorUserData);
      ppIVar3 = this->Layers[0].Data;
      if (ppIVar3 != (ImDrawList **)0x0) {
        memcpy(ppIVar4,ppIVar3,(long)this->Layers[0].Size << 3);
        ppIVar3 = this->Layers[0].Data;
        if (ppIVar3 != (ImDrawList **)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      this->Layers[0].Data = ppIVar4;
      this->Layers[0].Capacity = iVar7;
    }
  }
  this->Layers[0].Size = iVar6;
  uVar5 = this->Layers[1].Size;
  if ((ulong)uVar5 != 0) {
    if ((this->Layers[0].Size <= iVar1) || ((int)uVar5 < 1)) {
      __assert_fail("i < Size",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/imgui.h"
                    ,0x4c0,"value_type &ImVector<ImDrawList *>::operator[](int) [T = ImDrawList *]")
      ;
    }
    memcpy(this->Layers[0].Data + iVar1,this->Layers[1].Data,(ulong)uVar5 << 3);
    iVar1 = this->Layers[1].Capacity;
    if (iVar1 < 0) {
      uVar5 = iVar1 / 2 + iVar1;
      uVar8 = 0;
      if (0 < (int)uVar5) {
        uVar8 = (ulong)uVar5;
      }
      GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount + 1;
      ppIVar4 = (ImDrawList **)(*GImAllocatorAllocFunc)(uVar8 * 8,GImAllocatorUserData);
      ppIVar3 = this->Layers[1].Data;
      if (ppIVar3 != (ImDrawList **)0x0) {
        memcpy(ppIVar4,ppIVar3,(long)this->Layers[1].Size << 3);
        ppIVar3 = this->Layers[1].Data;
        if (ppIVar3 != (ImDrawList **)0x0) {
          GImAllocatorActiveAllocationsCount = GImAllocatorActiveAllocationsCount - 1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      this->Layers[1].Data = ppIVar4;
      this->Layers[1].Capacity = (int)uVar8;
    }
    this->Layers[1].Size = 0;
  }
  return;
}

Assistant:

void ImDrawDataBuilder::FlattenIntoSingleLayer()
{
    int n = Layers[0].Size;
    int size = n;
    for (int i = 1; i < IM_ARRAYSIZE(Layers); i++)
        size += Layers[i].Size;
    Layers[0].resize(size);
    for (int layer_n = 1; layer_n < IM_ARRAYSIZE(Layers); layer_n++)
    {
        ImVector<ImDrawList*>& layer = Layers[layer_n];
        if (layer.empty())
            continue;
        memcpy(&Layers[0][n], &layer[0], layer.Size * sizeof(ImDrawList*));
        n += layer.Size;
        layer.resize(0);
    }
}